

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

void __thiscall Func::SetHasUnoptimizedArgumentsAccess(Func *this,bool args)

{
  if ((*(uint *)&this->field_0x240 >> 10 & 1) == 0) {
    *(uint *)&this->field_0x240 = *(uint *)&this->field_0x240 | (uint)args << 10;
  }
  if (args) {
    while (this = this->parentFunc, this != (Func *)0x0) {
      this->field_0x241 = this->field_0x241 | 4;
    }
  }
  return;
}

Assistant:

void                SetHasUnoptimizedArgumentsAccess(bool args)
    {
                        // Once set to 'true' make sure this does not become false
                        if (!this->hasUnoptimizedArgumentsAccess)
                        {
                            this->hasUnoptimizedArgumentsAccess = args;
                        }

                        if (args)
                        {
                            Func *curFunc = this->GetParentFunc();
                            while (curFunc)
                            {
                                curFunc->hasUnoptimizedArgumentsAccess = args;
                                curFunc = curFunc->GetParentFunc();
                            }
                        }
    }